

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O0

int VHTightenHull(ImVec2 *hull,int n,double threshold)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int in_ESI;
  ImVec2 in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  int output_index;
  double ad;
  double a2;
  double a1;
  ImVec2 *c;
  ImVec2 *b;
  ImVec2 *a;
  int ni;
  int i;
  ImVec2 b_00;
  ImVec2 a_00;
  undefined4 local_74;
  undefined8 local_50;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    b_00 = in_RDI;
    a_00 = in_RDI;
    local_50 = VHAngleToX(in_RDI,in_RDI);
    dVar4 = VHAngleToX(a_00,b_00);
    if (local_50 <= dVar4) {
      local_50 = dVar4 - local_50;
    }
    else {
      local_50 = local_50 - dVar4;
    }
    if (local_50 < in_XMM0_Qa) {
      *(undefined8 *)((long)in_RDI + (long)((local_1c + 1) % in_ESI) * 8) =
           *(undefined8 *)((long)in_RDI + (long)local_1c * 8);
    }
  }
  local_74 = 0;
  local_1c = 0;
  while (local_1c < in_ESI) {
    iVar3 = (local_1c + 1) % in_ESI;
    fVar2 = *(float *)((long)in_RDI + (long)local_1c * 8);
    pfVar1 = (float *)((long)in_RDI + (long)iVar3 * 8);
    if ((((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) ||
        (fVar2 = *(float *)((long)in_RDI + 4 + (long)local_1c * 8),
        pfVar1 = (float *)((long)in_RDI + 4 + (long)iVar3 * 8), fVar2 != *pfVar1)) ||
       (NAN(fVar2) || NAN(*pfVar1))) {
      *(undefined8 *)((long)in_RDI + (long)local_74 * 8) =
           *(undefined8 *)((long)in_RDI + (long)local_1c * 8);
      local_74 = local_74 + 1;
      local_1c = local_1c + 1;
    }
    else {
      local_1c = local_1c + 1;
    }
  }
  return local_74;
}

Assistant:

int VHTightenHull(ImVec2 hull[], int n, double threshold) {
	// theory: circle the hull, compare 3 points at a time, if the mid point is
	// sub-angular then make it equal the first point and move to the 3rd.
	int i, ni;
	ImVec2 *a, *b, *c;
	double a1, a2, ad;
	// First cycle, we look for sub-threshold 2-segment runs
	for (i = 0; i < n; i++) {
		a = &(hull[i]);
		b = &(hull[(i + 1) % n]);
		c = &(hull[(i + 2) % n]);

		a1 = VHAngleToX(*a, *b);
		a2 = VHAngleToX(*b, *c);
		if (a1 > a2)
			ad = a1 - a2;
		else
			ad = a2 - a1;

		if (ad < threshold) {
			//			fprintf(stderr,"angle below threshold
			//(%0.2f)\n", ad);
			*b = *a;
		}
	} // end first cycle

	// Second cycle, we compact the hull
	int output_index = 0;
	i                = 0;
	while (i < n) {
		ni = (i + 1) % n;
		if ((hull[i].x == hull[ni].x) && (hull[i].y == hull[ni].y)) {
			// match found, discard one
			i++;
			continue;
		}

		hull[output_index] = hull[i];
		output_index++;
		i++;
	}

	return output_index;
}